

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_ncons.cc
# Opt level: O0

int equal_case(CBS *a,CBS *b)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  ulong local_38;
  size_t i;
  uint8_t *b_data;
  uint8_t *a_data;
  CBS *b_local;
  CBS *a_local;
  
  sVar3 = CBS_len(a);
  sVar4 = CBS_len(b);
  if (sVar3 == sVar4) {
    puVar5 = CBS_data(a);
    puVar6 = CBS_data(b);
    for (local_38 = 0; sVar3 = CBS_len(a), local_38 < sVar3; local_38 = local_38 + 1) {
      iVar1 = OPENSSL_tolower((uint)puVar5[local_38]);
      iVar2 = OPENSSL_tolower((uint)puVar6[local_38]);
      if (iVar1 != iVar2) {
        return 0;
      }
    }
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int equal_case(const CBS *a, const CBS *b) {
  if (CBS_len(a) != CBS_len(b)) {
    return 0;
  }
  // Note we cannot use |OPENSSL_strncasecmp| because that would stop
  // iterating at NUL.
  const uint8_t *a_data = CBS_data(a), *b_data = CBS_data(b);
  for (size_t i = 0; i < CBS_len(a); i++) {
    if (OPENSSL_tolower(a_data[i]) != OPENSSL_tolower(b_data[i])) {
      return 0;
    }
  }
  return 1;
}